

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_b(DisasContext_conflict10 *ctx)

{
  uint32_t uVar1;
  target_ulong tVar2;
  target_ulong local_20;
  target_ulong target;
  target_ulong li;
  DisasContext_conflict10 *ctx_local;
  
  ctx->exception = 0x201;
  tVar2 = LI(ctx->opcode);
  local_20 = (tVar2 ^ 0x2000000) - 0x2000000;
  uVar1 = AA(ctx->opcode);
  if (uVar1 == 0) {
    local_20 = ((ctx->base).pc_next + local_20) - 4;
  }
  uVar1 = LK(ctx->opcode);
  if (uVar1 != 0) {
    gen_setlr(ctx,(ctx->base).pc_next);
  }
  gen_update_cfar(ctx,(ctx->base).pc_next - 4);
  gen_goto_tb(ctx,0,local_20);
  return;
}

Assistant:

static void gen_b(DisasContext *ctx)
{
    target_ulong li, target;

    ctx->exception = POWERPC_EXCP_BRANCH;
    /* sign extend LI */
    li = LI(ctx->opcode);
    li = (li ^ 0x02000000) - 0x02000000;
    if (likely(AA(ctx->opcode) == 0)) {
        target = ctx->base.pc_next + li - 4;
    } else {
        target = li;
    }
    if (LK(ctx->opcode)) {
        gen_setlr(ctx, ctx->base.pc_next);
    }
    gen_update_cfar(ctx, ctx->base.pc_next - 4);
    gen_goto_tb(ctx, 0, target);
}